

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImVector<ImGuiOldColumnData> *this;
  float fVar1;
  ImGuiWindow *window;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiID id;
  ImGuiOldColumns *pIVar5;
  ImGuiOldColumnData *pIVar6;
  int n;
  int iVar7;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float local_78;
  ImGuiOldColumnData local_4c;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe92,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiOldColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar5 = FindOrCreateColumns(window,id);
    if (pIVar5->ID == id) {
      pIVar5->Current = 0;
      pIVar5->Count = columns_count;
      pIVar5->Flags = flags;
      (window->DC).CurrentColumns = pIVar5;
      pIVar5->HostCursorPosY = (window->DC).CursorPos.y;
      pIVar5->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
      IVar3 = (window->ClipRect).Max;
      (pIVar5->HostInitialClipRect).Min = (window->ClipRect).Min;
      (pIVar5->HostInitialClipRect).Max = IVar3;
      IVar3 = (window->ParentWorkRect).Max;
      (pIVar5->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
      (pIVar5->HostBackupParentWorkRect).Max = IVar3;
      IVar3 = (window->WorkRect).Max;
      (window->ParentWorkRect).Min = (window->WorkRect).Min;
      (window->ParentWorkRect).Max = IVar3;
      fVar9 = (window->WindowPadding).x;
      auVar11 = ZEXT416((uint)(fVar9 * 0.5));
      auVar2 = vcmpss_avx(ZEXT416((uint)window->WindowBorderSize),auVar11,2);
      auVar2 = vblendvps_avx(ZEXT416((uint)window->WindowBorderSize),auVar11,auVar2);
      fVar1 = (pIVar4->Style).ItemSpacing.x;
      auVar11._0_4_ = (int)auVar2._0_4_;
      auVar11._4_4_ = (int)auVar2._4_4_;
      auVar11._8_4_ = (int)auVar2._8_4_;
      auVar11._12_4_ = (int)auVar2._12_4_;
      auVar11 = vcvtdq2ps_avx(auVar11);
      fVar8 = (window->WorkRect).Max.x;
      auVar10 = ZEXT416((uint)(fVar1 - fVar9));
      auVar2 = vcmpss_avx(ZEXT816(0) << 0x40,auVar10,2);
      auVar2 = vandps_avx(auVar2,auVar10);
      auVar11 = vminss_avx(ZEXT416((uint)((fVar1 + fVar8) - auVar2._0_4_)),
                           ZEXT416((uint)(fVar8 + auVar11._0_4_)));
      fVar9 = auVar2._0_4_ + ((window->DC).Indent.x - fVar1);
      pIVar5->OffMinX = fVar9;
      auVar10 = ZEXT416((uint)(fVar9 + 1.0));
      auVar11 = ZEXT416((uint)(auVar11._0_4_ - (window->Pos).x));
      auVar2 = vcmpss_avx(auVar10,auVar11,2);
      auVar2 = vblendvps_avx(auVar10,auVar11,auVar2);
      pIVar5->OffMaxX = auVar2._0_4_;
      fVar9 = (window->DC).CursorPos.y;
      pIVar5->LineMaxY = fVar9;
      pIVar5->LineMinY = fVar9;
      this = &pIVar5->Columns;
      iVar7 = (pIVar5->Columns).Size;
      if (iVar7 != columns_count + 1 && iVar7 != 0) {
        ImVector<ImGuiOldColumnData>::resize(this,0);
        iVar7 = this->Size;
      }
      pIVar5->IsFirstFrame = iVar7 == 0;
      if (iVar7 == 0) {
        ImVector<ImGuiOldColumnData>::reserve(this,columns_count + 1);
        for (iVar7 = 0; iVar7 <= columns_count; iVar7 = iVar7 + 1) {
          local_4c.ClipRect.Max.x = 0.0;
          local_4c.ClipRect.Max.y = 0.0;
          local_4c.OffsetNormBeforeResize = 0.0;
          local_4c.Flags = 0;
          local_4c.ClipRect.Min.x = 0.0;
          local_4c.ClipRect.Min.y = 0.0;
          local_4c.OffsetNorm = (float)iVar7 / (float)columns_count;
          ImVector<ImGuiOldColumnData>::push_back(this,&local_4c);
        }
      }
      iVar7 = 0;
      while (columns_count != iVar7) {
        pIVar6 = ImVector<ImGuiOldColumnData>::operator[](this,iVar7);
        fVar9 = (window->Pos).x;
        fVar8 = GetColumnOffset(iVar7);
        auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar8 + fVar9 + 0.5)));
        fVar9 = (window->Pos).x;
        iVar7 = iVar7 + 1;
        fVar8 = GetColumnOffset(iVar7);
        auVar11 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar8 + fVar9 + -1.0 + 0.5)));
        local_78 = auVar2._0_4_;
        (pIVar6->ClipRect).Min.x = local_78;
        (pIVar6->ClipRect).Min.y = -3.4028235e+38;
        (pIVar6->ClipRect).Max.x = auVar11._0_4_;
        (pIVar6->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar6->ClipRect,&window->ClipRect);
      }
      if (1 < pIVar5->Count) {
        ImDrawListSplitter::Split(&pIVar5->Splitter,window->DrawList,pIVar5->Count + 1);
        ImDrawListSplitter::SetCurrentChannel(&pIVar5->Splitter,window->DrawList,1);
        PushColumnClipRect(0);
      }
      fVar9 = GetColumnOffset(pIVar5->Current);
      fVar8 = GetColumnOffset(pIVar5->Current + 1);
      PushItemWidth((fVar8 - fVar9) * 0.65);
      auVar11 = ZEXT416((uint)(fVar1 - (window->WindowPadding).x));
      auVar2 = vcmpss_avx(ZEXT816(0) << 0x40,auVar11,2);
      auVar2 = vandps_avx(auVar2,auVar11);
      (window->DC).ColumnsOffset.x = auVar2._0_4_;
      fVar9 = (window->Pos).x;
      auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar2._0_4_ + fVar9 + (window->DC).Indent.x)));
      (window->DC).CursorPos.x = auVar2._0_4_;
      (window->WorkRect).Max.x = (fVar9 + fVar8) - fVar1;
      return;
    }
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe98,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0xe93,"void ImGui::BeginColumns(const char *, int, ImGuiOldColumnFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}